

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_CHALLENGE_HANDLE sasl_challenge_create(amqp_binary challenge_value)

{
  int iVar1;
  SASL_CHALLENGE_INSTANCE_TAG SVar2;
  AMQP_VALUE item_value;
  amqp_binary value;
  undefined4 local_2c;
  int result;
  AMQP_VALUE challenge_amqp_value;
  SASL_CHALLENGE_INSTANCE *sasl_challenge_instance;
  amqp_binary challenge_value_local;
  
  challenge_amqp_value = (AMQP_VALUE)malloc(8);
  if (challenge_amqp_value != (AMQP_VALUE)0x0) {
    SVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x42);
    *(AMQP_VALUE *)challenge_amqp_value = SVar2.composite_value;
    if (*(AMQP_VALUE *)challenge_amqp_value == (AMQP_VALUE)0x0) {
      free(challenge_amqp_value);
      challenge_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_2c = 0;
      value._12_4_ = 0;
      value.bytes = (void *)SUB128(challenge_value._0_12_,0);
      value.length = SUB124(challenge_value._0_12_,8);
      item_value = amqpvalue_create_binary(value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)challenge_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_2c = 0x2af9;
      }
      amqpvalue_destroy(item_value);
      if (local_2c != 0) {
        sasl_challenge_destroy((SASL_CHALLENGE_HANDLE)challenge_amqp_value);
        challenge_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (SASL_CHALLENGE_HANDLE)challenge_amqp_value;
}

Assistant:

SASL_CHALLENGE_HANDLE sasl_challenge_create(amqp_binary challenge_value)
{
    SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)malloc(sizeof(SASL_CHALLENGE_INSTANCE));
    if (sasl_challenge_instance != NULL)
    {
        sasl_challenge_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(66);
        if (sasl_challenge_instance->composite_value == NULL)
        {
            free(sasl_challenge_instance);
            sasl_challenge_instance = NULL;
        }
        else
        {
            AMQP_VALUE challenge_amqp_value;
            int result = 0;

            challenge_amqp_value = amqpvalue_create_binary(challenge_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_challenge_instance->composite_value, 0, challenge_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(challenge_amqp_value);
            if (result != 0)
            {
                sasl_challenge_destroy(sasl_challenge_instance);
                sasl_challenge_instance = NULL;
            }
        }
    }

    return sasl_challenge_instance;
}